

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

void __thiscall FTagManager::AddSectorTag(FTagManager *this,int sector,int tag)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  FTagItem it;
  FTagItem local_34;
  
  if (tag != 0) {
    while ((this->startForSector).Count <= (uint)sector) {
      local_34.target = -1;
      TArray<int,_int>::Push(&this->startForSector,&local_34.target);
    }
    piVar5 = (this->startForSector).Array;
    uVar3 = (ulong)(uint)piVar5[sector];
    uVar1 = (this->allTags).Count;
    if (uVar3 == 0xffffffff) {
      piVar5[sector] = uVar1;
LAB_00455325:
      local_34.nexttag = -1;
      local_34.target = sector;
      local_34.tag = tag;
      TArray<FTagItem,_FTagItem>::Push(&this->allTags,&local_34);
    }
    else {
      uVar4 = uVar3 - 1;
      piVar5 = &(this->allTags).Array[uVar3].tag;
      do {
        uVar4 = uVar4 + 1;
        if (uVar1 <= uVar4) goto LAB_00455325;
        iVar2 = *piVar5;
        piVar5 = piVar5 + 3;
      } while (iVar2 != tag);
    }
  }
  return;
}

Assistant:

void FTagManager::AddSectorTag(int sector, int tag)
{
	if (tag == 0) return;

	// This function assumes that all tags for a single sector get added sequentially.
	// Should there ever be some need for compatibility.txt to add tags to sectors which already have a tag this function needs to be changed to adjust the startForSector indices.
	while (startForSector.Size() <= (unsigned int)sector)
	{
		startForSector.Push(-1);
	}
	if (startForSector[sector] == -1)
	{
		startForSector[sector] = allTags.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForSector[sector]; i < allTags.Size(); i++)
		{
			if (allTags[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { sector, tag, -1 };
	allTags.Push(it);
}